

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O3

Expression * __thiscall
slang::ast::AssertionInstanceExpression::bindPort
          (AssertionInstanceExpression *this,Symbol *symbol,SourceRange range,
          ASTContext *instanceCtx)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  SymbolKind SVar3;
  AssertionExprKind AVar4;
  Compilation *compilation;
  int *piVar5;
  value_type_pointer ppVar6;
  SyntaxNode *pSVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  string_view arg;
  not_null<const_slang::ast::Scope_*> *pnVar10;
  _Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *p_Var11;
  bool bVar12;
  int iVar13;
  undefined8 *puVar14;
  ulong uVar15;
  Diagnostic *pDVar16;
  AssertionInstanceExpression *pAVar17;
  Expression *pEVar18;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Type *pTVar19;
  SourceLocation this_00;
  AssertionInstanceDetails *pAVar20;
  ulong uVar21;
  DiagCode code;
  SyntaxKind SVar22;
  AssertionInstanceDetails *pAVar23;
  ASTContext *pAVar24;
  ExpressionSyntax *syntax;
  ASTContext *instanceCtx_00;
  uint uVar25;
  ulong uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  byte bVar30;
  undefined1 auVar31 [16];
  SourceRange sourceRange;
  SourceRange range_00;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  AssertionInstanceDetails details;
  ConversionKind local_134;
  SourceRange local_130;
  Type *local_120;
  ASTContext local_118;
  AssertionExpr *pAStack_e0;
  uchar local_d8;
  uchar uStack_d7;
  uchar uStack_d6;
  byte bStack_d5;
  uchar uStack_d4;
  uchar uStack_d3;
  uchar uStack_d2;
  byte bStack_d1;
  uchar uStack_d0;
  uchar uStack_cf;
  uchar uStack_ce;
  byte bStack_cd;
  uchar uStack_cc;
  uchar uStack_cb;
  uchar uStack_ca;
  byte bStack_c9;
  AssertionInstanceDetails local_c8;
  
  this_00 = range.endLoc;
  range_00.startLoc = range.startLoc;
  puVar14 = *(undefined8 **)this_00;
  pAVar20 = *(AssertionInstanceDetails **)((long)this_00 + 0x30);
  compilation = (Compilation *)*puVar14;
  local_130.startLoc = (SourceLocation)symbol;
  local_130.endLoc = range_00.startLoc;
  if (pAVar20 == (AssertionInstanceDetails *)0x0) {
    do {
      piVar5 = (int *)puVar14[1];
      if (*piVar5 == 0x58) {
        pAVar20 = *(AssertionInstanceDetails **)(piVar5 + 0x22);
        goto LAB_00423e58;
      }
      puVar14 = *(undefined8 **)(piVar5 + 8);
    } while (puVar14 != (undefined8 *)0x0);
  }
  else {
LAB_00423e58:
    pAVar23 = pAVar20->argDetails;
    if (pAVar20->argDetails == (AssertionInstanceDetails *)0x0) {
      pAVar23 = pAVar20;
    }
    auVar9._8_8_ = 0;
    auVar9._0_8_ = this;
    uVar21 = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar15 = uVar21 >> ((byte)(pAVar23->argumentMap).table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                              .arrays.groups_size_index & 0x3f);
    uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar21 & 0xff];
    instanceCtx_00 = (ASTContext *)0x0;
    do {
      pgVar1 = (pAVar23->argumentMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
               .arrays.groups_ + uVar15;
      local_d8 = pgVar1->m[0].n;
      uStack_d7 = pgVar1->m[1].n;
      uStack_d6 = pgVar1->m[2].n;
      bStack_d5 = pgVar1->m[3].n;
      uStack_d4 = pgVar1->m[4].n;
      uStack_d3 = pgVar1->m[5].n;
      uStack_d2 = pgVar1->m[6].n;
      bStack_d1 = pgVar1->m[7].n;
      uStack_d0 = pgVar1->m[8].n;
      uStack_cf = pgVar1->m[9].n;
      uStack_ce = pgVar1->m[10].n;
      bStack_cd = pgVar1->m[0xb].n;
      uStack_cc = pgVar1->m[0xc].n;
      uStack_cb = pgVar1->m[0xd].n;
      uStack_ca = pgVar1->m[0xe].n;
      bStack_c9 = pgVar1->m[0xf].n;
      uVar27 = (uchar)uVar2;
      auVar31[0] = -(local_d8 == uVar27);
      uVar28 = (uchar)((uint)uVar2 >> 8);
      auVar31[1] = -(uStack_d7 == uVar28);
      uVar29 = (uchar)((uint)uVar2 >> 0x10);
      auVar31[2] = -(uStack_d6 == uVar29);
      bVar30 = (byte)((uint)uVar2 >> 0x18);
      auVar31[3] = -(bStack_d5 == bVar30);
      auVar31[4] = -(uStack_d4 == uVar27);
      auVar31[5] = -(uStack_d3 == uVar28);
      auVar31[6] = -(uStack_d2 == uVar29);
      auVar31[7] = -(bStack_d1 == bVar30);
      auVar31[8] = -(uStack_d0 == uVar27);
      auVar31[9] = -(uStack_cf == uVar28);
      auVar31[10] = -(uStack_ce == uVar29);
      auVar31[0xb] = -(bStack_cd == bVar30);
      auVar31[0xc] = -(uStack_cc == uVar27);
      auVar31[0xd] = -(uStack_cb == uVar28);
      auVar31[0xe] = -(uStack_ca == uVar29);
      auVar31[0xf] = -(bStack_c9 == bVar30);
      uVar25 = (uint)(ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe);
      if (uVar25 != 0) {
        ppVar6 = (pAVar23->argumentMap).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                 .arrays.elements_;
        do {
          uVar8 = 0;
          if (uVar25 != 0) {
            for (; (uVar25 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
            }
          }
          uVar26 = (ulong)uVar8;
          if ((AssertionInstanceExpression *)ppVar6[uVar15 * 0xf + uVar26].first == this) {
            local_120 = DeclaredType::getType((DeclaredType *)&this->arguments);
            pTVar19 = local_120->canonical;
            if (pTVar19 == (Type *)0x0) {
              Type::resolveCanonical(local_120);
              pTVar19 = local_120->canonical;
            }
            SVar3 = (pTVar19->super_Symbol).kind;
            if ((SVar3 == UntypedType) || (SVar3 == ErrorType)) {
LAB_00423fc5:
              uVar21 = ((bitmask<slang::ast::ASTFlags> *)((long)this_00 + 0x10))->m_bits;
              uVar25 = (uint)uVar21;
              if ((uVar25 >> 0x17 & 1) == 0) {
                local_118.scope.ptr =
                     ppVar6[uVar15 * 0xf + uVar26].second.
                     super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                     .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                     super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr;
                p_Var11 = &ppVar6[uVar15 * 0xf + uVar26].second.
                           super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                ;
                local_118.lookupIndex =
                     (p_Var11->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
                     super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex;
                local_118._12_4_ =
                     *(undefined4 *)
                      &(p_Var11->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
                       super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc;
                local_118.flags.m_bits =
                     ppVar6[uVar15 * 0xf + uVar26].second.
                     super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                     .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                     super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits;
                local_118.instanceOrProc =
                     ppVar6[uVar15 * 0xf + uVar26].second.
                     super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                     .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                     super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                     instanceOrProc;
                local_118.firstTempVar =
                     ppVar6[uVar15 * 0xf + uVar26].second.
                     super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                     .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                     super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar;
                local_118.randomizeDetails =
                     ppVar6[uVar15 * 0xf + uVar26].second.
                     super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                     .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                     super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                     randomizeDetails;
                local_118.assertionInstance =
                     ppVar6[uVar15 * 0xf + uVar26].second.
                     super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                     .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                     super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                     assertionInstance;
                pAStack_e0 = (AssertionExpr *)
                             ppVar6[uVar15 * 0xf + uVar26].second.
                             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                             .
                             super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>
                             ._M_head_impl;
                if (pAStack_e0 == (AssertionExpr *)0x0) {
                  pAVar17 = (AssertionInstanceExpression *)
                            Expression::badExpr(compilation,(Expression *)0x0);
                  return &pAVar17->super_Expression;
                }
                AVar4 = pAStack_e0->kind;
                if (((AVar4 == 0x1af) &&
                    (pSVar7 = pAStack_e0[1].syntax, pSVar7->kind == SimpleSequenceExpr)) &&
                   (pSVar7[1].parent == (SyntaxNode *)0x0)) {
                  syntax = *(ExpressionSyntax **)(pSVar7 + 1);
                }
                else {
                  syntax = (ExpressionSyntax *)0x0;
                }
                local_118.flags.m_bits = local_118.flags.m_bits | uVar21;
                local_c8.symbol = (Symbol *)0x0;
                local_c8.instanceLoc = (SourceLocation)0x0;
                local_c8.argumentMap.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                .arrays.groups_size_index = 0x3f;
                local_c8.argumentMap.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                .arrays.groups_size_mask = 1;
                local_c8.argumentMap.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                .arrays.elements_ = (value_type_pointer)0x0;
                local_c8.argumentMap.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                .arrays.groups_ =
                     (group_type_pointer)
                     &boost::unordered::detail::foa::
                      dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                      ::storage;
                local_c8.argumentMap.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                .size_ctrl.ml = 0;
                local_c8.argumentMap.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                .size_ctrl.size = 0;
                local_c8.localVars.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                .arrays.groups_size_index = 0x3f;
                local_c8.localVars.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                .arrays.groups_size_mask = 1;
                local_c8.localVars.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                .arrays.elements_ = (value_type_pointer)0x0;
                local_c8.localVars.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                .arrays.groups_ =
                     (group_type_pointer)
                     &boost::unordered::detail::foa::
                      dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                      ::storage;
                local_c8.localVars.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                .size_ctrl.ml = 0;
                local_c8.localVars.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                .size_ctrl.size = 0;
                local_c8.isRecursive = false;
                uVar8 = SVar3 - SequenceType;
                local_c8.argDetails = local_118.assertionInstance;
                local_118.assertionInstance = &local_c8;
                local_c8.prevContext = (ASTContext *)this_00;
                local_c8.argExpansionLoc = (SourceLocation)symbol;
                if (uVar8 < 2) {
                  iVar13 = AssertionExpr::bind(pAStack_e0,(int)&local_118,(sockaddr *)0x0,0);
                  SVar22 = PropertyType;
                  if (SVar3 == SequenceType) {
                    SVar22 = SequenceType;
                  }
                  pTVar19 = Compilation::getType(compilation,SVar22);
                  local_134 = local_134 & 0xffffff00;
                  pAVar17 = BumpAllocator::
                            emplace<slang::ast::AssertionInstanceExpression,slang::ast::Type_const&,slang::ast::AssertionPortSymbol_const&,slang::ast::AssertionExpr_const&,bool,slang::SourceRange&>
                                      ((BumpAllocator *)compilation,pTVar19,
                                       (AssertionPortSymbol *)this,
                                       (AssertionExpr *)CONCAT44(extraout_var,iVar13),
                                       (bool *)&local_134,&local_130);
                  goto LAB_004242cc;
                }
                if (SVar3 == EventType) {
                  if ((~uVar25 & 0x24000) == 0) {
                    iVar13 = TimingControl::bind((int)pAStack_e0,(sockaddr *)&local_118,uVar8);
                    pAVar17 = (AssertionInstanceExpression *)
                              BumpAllocator::
                              emplace<slang::ast::ClockingEventExpression,slang::ast::Type_const&,slang::ast::TimingControl&,slang::SourceRange&>
                                        ((BumpAllocator *)compilation,compilation->voidType,
                                         (TimingControl *)CONCAT44(extraout_var_00,iVar13),
                                         &local_130);
                    goto LAB_004242cc;
                  }
                  sourceRange_01.endLoc = range_00.startLoc;
                  sourceRange_01.startLoc = (SourceLocation)symbol;
                  ASTContext::addDiag((ASTContext *)this_00,(DiagCode)0x500007,sourceRange_01);
                }
                else {
                  if (SVar3 == UntypedType) {
                    if (syntax == (ExpressionSyntax *)0x0) {
                      if ((~uVar25 & 0x24000) == 0) {
                        iVar13 = TimingControl::bind((int)pAStack_e0,(sockaddr *)&local_118,uVar8);
                        pAVar17 = (AssertionInstanceExpression *)
                                  BumpAllocator::
                                  emplace<slang::ast::ClockingEventExpression,slang::ast::Type_const&,slang::ast::TimingControl&,slang::SourceRange&>
                                            ((BumpAllocator *)compilation,compilation->voidType,
                                             (TimingControl *)CONCAT44(extraout_var_01,iVar13),
                                             &local_130);
                      }
                      else {
                        iVar13 = AssertionExpr::bind(pAStack_e0,(int)&local_118,(sockaddr *)0x0,0);
                        SVar22 = PropertyType;
                        if (AVar4 == 0x1af) {
                          SVar22 = SequenceType;
                        }
                        pTVar19 = Compilation::getType(compilation,SVar22);
                        local_134 = local_134 & 0xffffff00;
                        pAVar17 = BumpAllocator::
                                  emplace<slang::ast::AssertionInstanceExpression,slang::ast::Type_const&,slang::ast::AssertionPortSymbol_const&,slang::ast::AssertionExpr_const&,bool,slang::SourceRange&>
                                            ((BumpAllocator *)compilation,pTVar19,
                                             (AssertionPortSymbol *)this,
                                             (AssertionExpr *)CONCAT44(extraout_var_02,iVar13),
                                             (bool *)&local_134,&local_130);
                      }
                    }
                    else {
                      pAVar17 = (AssertionInstanceExpression *)
                                Expression::selfDetermined
                                          (compilation,syntax,&local_118,local_118.flags);
                      (pAVar17->super_Expression).sourceRange.startLoc = local_130.startLoc;
                      (pAVar17->super_Expression).sourceRange.endLoc = local_130.endLoc;
                    }
                    goto LAB_004242cc;
                  }
                  if (syntax != (ExpressionSyntax *)0x0) {
                    pAVar17 = (AssertionInstanceExpression *)
                              Expression::selfDetermined
                                        (compilation,syntax,&local_118,local_118.flags);
                    pTVar19 = local_120;
                    (pAVar17->super_Expression).sourceRange.startLoc = local_130.startLoc;
                    (pAVar17->super_Expression).sourceRange.endLoc = local_130.endLoc;
                    if (((*(byte *)((long)this_00 + 0x12) & 0x10) == 0) &&
                       (bVar12 = Type::isMatching((pAVar17->super_Expression).type.ptr,local_120),
                       !bVar12)) {
                      local_134 = Explicit;
                      pAVar17 = (AssertionInstanceExpression *)
                                BumpAllocator::
                                emplace<slang::ast::ConversionExpression,slang::ast::Type_const&,slang::ast::ConversionKind,slang::ast::Expression&,slang::SourceRange&>
                                          ((BumpAllocator *)compilation,pTVar19,&local_134,
                                           (Expression *)pAVar17,&local_130);
                    }
                    goto LAB_004242cc;
                  }
                }
                pAVar17 = (AssertionInstanceExpression *)
                          Expression::badExpr(compilation,(Expression *)0x0);
LAB_004242cc:
                if (local_c8.localVars.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                    .arrays.elements_ != (value_type_pointer)0x0) {
                  operator_delete(local_c8.localVars.table_.
                                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                                  .arrays.elements_,
                                  ((local_c8.localVars.table_.
                                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                                    .arrays.groups_size_mask * 0x178 + 0x186) / 3 &
                                  0xfffffffffffffff8) * 3);
                }
                if (local_c8.argumentMap.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                    .arrays.elements_ == (value_type_pointer)0x0) {
                  return &pAVar17->super_Expression;
                }
                operator_delete(local_c8.argumentMap.table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                                .arrays.elements_,
                                ((local_c8.argumentMap.table_.
                                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                                  .arrays.groups_size_mask * 0x448 + 0x456) / 9 & 0xfffffffffffffff8
                                ) * 9);
                return &pAVar17->super_Expression;
              }
              code.subsystem = Expressions;
              code.code = 0x8d;
            }
            else {
              uVar25 = (uint)((bitmask<slang::ast::ASTFlags> *)((long)this_00 + 0x10))->m_bits;
              if (((uVar25 >> 0x13 & 1) != 0) &&
                 ((SVar3 != PredefinedIntegerType || (2 < (uint)pTVar19[1].super_Symbol.name._M_len)
                  ))) {
                sourceRange_00.endLoc = range_00.startLoc;
                sourceRange_00.startLoc = (SourceLocation)symbol;
                pDVar16 = ASTContext::addDiag((ASTContext *)this_00,(DiagCode)0x50007,sourceRange_00
                                             );
                ast::operator<<(pDVar16,local_120);
                Diagnostic::addNote(pDVar16,(DiagCode)0x50001,
                                    (SourceLocation)(this->super_Expression).syntax);
                goto LAB_0042419c;
              }
              if (((uVar25 >> 0x14 & 1) == 0) ||
                 (this[1].super_Expression.sourceRange.startLoc.field_0x4 != '\0'))
              goto LAB_00423fc5;
              code.subsystem = Expressions;
              code.code = 8;
            }
            sourceRange.endLoc = range_00.startLoc;
            sourceRange.startLoc = (SourceLocation)symbol;
            pDVar16 = ASTContext::addDiag((ASTContext *)this_00,code,sourceRange);
            arg._M_len = *(size_t *)&(this->super_Expression).type;
            arg._M_str = (char *)(this->super_Expression).constant;
            Diagnostic::operator<<(pDVar16,arg);
            goto LAB_0042419c;
          }
          uVar25 = uVar25 - 1 & uVar25;
        } while (uVar25 != 0);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar21 & 7] & bStack_c9) == 0) break;
      pAVar24 = (ASTContext *)
                (pAVar23->argumentMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                .arrays.groups_size_mask;
      pnVar10 = &instanceCtx_00->scope;
      instanceCtx_00 = (ASTContext *)((long)&(instanceCtx_00->scope).ptr + 1);
      uVar15 = (long)&pnVar10->ptr + uVar15 + 1 & (ulong)pAVar24;
    } while (instanceCtx_00 <= pAVar24);
    pAVar24 = pAVar23->prevContext;
    while (pAVar24 != (ASTContext *)0x0) {
      pAVar20 = pAVar24->assertionInstance;
      if ((pAVar20 == (AssertionInstanceDetails *)0x0) ||
         ((pAVar20->symbol != (Symbol *)0x0 && (pAVar20->symbol->kind == Checker)))) {
        ASTContext::resetFlags
                  ((ASTContext *)&local_c8,pAVar24,
                   (bitmask<slang::ast::ASTFlags>)
                   ((bitmask<slang::ast::ASTFlags> *)((long)this_00 + 0x10))->m_bits);
        range_00.endLoc = (SourceLocation)&local_c8;
        pAVar17 = (AssertionInstanceExpression *)bindPort(this,symbol,range_00,instanceCtx_00);
        return &pAVar17->super_Expression;
      }
      pAVar24 = pAVar20->prevContext;
    }
  }
LAB_0042419c:
  pEVar18 = Expression::badExpr(compilation,(Expression *)0x0);
  return pEVar18;
}

Assistant:

Expression& AssertionInstanceExpression::bindPort(const Symbol& symbol, SourceRange range,
                                                  const ASTContext& instanceCtx) {
    Compilation& comp = instanceCtx.getCompilation();

    auto inst = instanceCtx.assertionInstance;
    if (!inst) {
        // This is only possible if we're in a checker instance,
        // so look upward until we find it.
        auto sym = &instanceCtx.scope->asSymbol();
        while (sym->kind != SymbolKind::CheckerInstanceBody) {
            auto scope = sym->getParentScope();
            if (!scope)
                return badExpr(comp, nullptr);

            sym = &scope->asSymbol();
        }

        inst = &sym->as<CheckerInstanceBodySymbol>().assertionDetails;
    }

    // When looking up an argument reference from within another expanded
    // argument, use that original location's context.
    if (inst->argDetails)
        inst = inst->argDetails;

    // The only way to reference an assertion port should be from within
    // an assertion or checker instance.
    auto it = inst->argumentMap.find(&symbol);
    if (it == inst->argumentMap.end()) {
        // Walk through our previous assertion contexts to see if one of
        // them is a checker instance, in which case this argument might
        // be a reference to a checker port.
        auto ctx = inst->prevContext;
        while (ctx) {
            inst = ctx->assertionInstance;
            if (!inst || (inst->symbol && inst->symbol->kind == SymbolKind::Checker))
                return bindPort(symbol, range, ctx->resetFlags(instanceCtx.flags));

            ctx = inst->prevContext;
        }

        SLANG_ASSERT(false);
        return badExpr(comp, nullptr);
    }

    auto& formal = symbol.as<AssertionPortSymbol>();
    auto& type = formal.declaredType.getType();
    auto typeKind = type.getCanonicalType().kind;

    if (typeKind != SymbolKind::ErrorType && typeKind != SymbolKind::UntypedType) {
        if (instanceCtx.flags.has(ASTFlags::AssertionDelayOrRepetition)) {
            auto isAllowedIntType = [&] {
                if (typeKind != SymbolKind::PredefinedIntegerType)
                    return false;

                auto ik = type.getCanonicalType().as<PredefinedIntegerType>().integerKind;
                return ik == PredefinedIntegerType::Int || ik == PredefinedIntegerType::ShortInt ||
                       ik == PredefinedIntegerType::LongInt;
            };

            if (!isAllowedIntType()) {
                auto& diag = instanceCtx.addDiag(diag::AssertionDelayFormalType, range);
                diag << type;
                diag.addNote(diag::NoteDeclarationHere, formal.location);
                return badExpr(comp, nullptr);
            }
        }

        if (instanceCtx.flags.has(ASTFlags::LValue) && !formal.direction) {
            instanceCtx.addDiag(diag::AssertionPortTypedLValue, range) << formal.name;
            return badExpr(comp, nullptr);
        }
    }

    if (instanceCtx.flags.has(ASTFlags::RecursivePropertyArg)) {
        instanceCtx.addDiag(diag::RecursivePropArgExpr, range) << formal.name;
        return badExpr(comp, nullptr);
    }

    auto [propExpr, argCtx] = it->second;
    if (!propExpr) {
        // The expression can be null when making default instances of
        // sequences and properties. Just return an invalid expression.
        return badExpr(comp, nullptr);
    }

    auto [seqExpr, regExpr] = decomposePropExpr(*propExpr);

    // Inherit any AST flags that are specific to this argument's instantiation.
    argCtx.flags |= instanceCtx.flags;

    AssertionInstanceDetails details;
    details.argExpansionLoc = range.start();
    details.prevContext = &instanceCtx;
    details.argDetails = argCtx.assertionInstance;
    argCtx.assertionInstance = &details;

    switch (typeKind) {
        case SymbolKind::UntypedType:
            // Untyped formals allow everything. Bind as a regular expression
            // if possible and fall back to an assertion expression if not.
            if (regExpr) {
                auto& result = selfDetermined(comp, *regExpr, argCtx, argCtx.flags);
                result.sourceRange = range;
                return result;
            }
            else if (instanceCtx.flags.has(ASTFlags::EventExpression) &&
                     instanceCtx.flags.has(ASTFlags::AllowClockingBlock)) {
                // In an event expression, a referenced argument gets interpreted
                // as an event expression itself and not as an assertion expression.
                auto& timing = TimingControl::bind(*propExpr, argCtx);
                return *comp.emplace<ClockingEventExpression>(comp.getVoidType(), timing, range);
            }
            else {
                auto& result = AssertionExpr::bind(*propExpr, argCtx);
                auto& resultType = seqExpr ? comp.getType(SyntaxKind::SequenceType)
                                           : comp.getType(SyntaxKind::PropertyType);
                return *comp.emplace<AssertionInstanceExpression>(resultType, formal, result,
                                                                  /* isRecursiveProperty */ false,
                                                                  range);
            }
        case SymbolKind::SequenceType:
        case SymbolKind::PropertyType: {
            auto& result = AssertionExpr::bind(*propExpr, argCtx);
            auto& resultType = typeKind == SymbolKind::SequenceType
                                   ? comp.getType(SyntaxKind::SequenceType)
                                   : comp.getType(SyntaxKind::PropertyType);

            return *comp.emplace<AssertionInstanceExpression>(resultType, formal, result,
                                                              /* isRecursiveProperty */ false,
                                                              range);
        }
        case SymbolKind::EventType:
            // If an event expression is allowed here, bind and return. Otherwise issue
            // an error, since an 'event' argument can only be used where event expressions
            // are allowed, regardless of what the actual argument expression looks like.
            if (instanceCtx.flags.has(ASTFlags::EventExpression) &&
                instanceCtx.flags.has(ASTFlags::AllowClockingBlock)) {
                auto& timing = TimingControl::bind(*propExpr, argCtx);
                return *comp.emplace<ClockingEventExpression>(comp.getVoidType(), timing, range);
            }

            instanceCtx.addDiag(diag::EventExprAssertionArg, range);
            return badExpr(comp, nullptr);
        default: {
            // Arguments should have already been checked for type correctness.
            if (!regExpr)
                return badExpr(comp, nullptr);

            auto& expr = selfDetermined(comp, *regExpr, argCtx, argCtx.flags);
            expr.sourceRange = range;

            if (!instanceCtx.flags.has(ASTFlags::LValue) && !expr.type->isMatching(type)) {
                return *comp.emplace<ConversionExpression>(type, ConversionKind::Explicit, expr,
                                                           range);
            }

            return expr;
        }
    }
}